

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O1

void doDecodeTile(exr_context_t f,pixels *p,int xs,int ys)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  undefined4 in_register_0000000c;
  int *func;
  int iVar8;
  long lVar9;
  long lVar10;
  exr_context_t p_Var11;
  int32_t tileh;
  int32_t tilew;
  int32_t linestride;
  int32_t pixelstride;
  int32_t tlevy;
  int32_t tlevx;
  void *ptr;
  exr_chunk_info_t cinfo;
  exr_decode_pipeline_t decoder;
  int local_2b0;
  int local_2ac;
  int local_2a8;
  int local_2a4;
  char *local_2a0;
  exr_context_t local_298;
  int local_290;
  int local_28c;
  int local_288;
  int local_284;
  int32_t local_280;
  uint local_27c;
  int local_278;
  int local_274;
  void *local_270;
  undefined1 local_268 [64];
  char local_228 [8];
  char *local_220;
  short local_218;
  
  if ((xs != 1) || (ys != 1)) {
    core_test_fail("xs == 1 && ys == 1",(char *)0x3de,0x185706,
                   (char *)CONCAT44(in_register_0000000c,ys));
  }
  func = &local_278;
  local_298 = f;
  iVar2 = exr_get_tile_levels(f,0,&local_274);
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(iVar2);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_get_tile_levels (f, 0, &tlevx, &tlevy)",(char *)0x3df,0x185706,(char *)func)
    ;
  }
  if ((local_274 == 1) && (local_278 == 1)) {
    pcVar5 = (char *)0x0;
    iVar2 = exr_get_tile_sizes(local_298,0,0,0,&local_2ac,&local_2b0);
    if (iVar2 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
      pcVar7 = (char *)exr_get_default_error_message(iVar2);
      if (pcVar7 == (char *)0x0) {
        std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
      }
      else {
        sVar6 = strlen(pcVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar6);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      core_test_fail("exr_get_tile_sizes (f, 0, 0, 0, &tilew, &tileh)",(char *)0x3e2,0x185706,pcVar5
                    );
    }
    if ((local_2ac != 0x20) || (local_2b0 != 0x20)) {
      core_test_fail("tilew == 32 && tileh == 32",(char *)0x3e3,0x185706,pcVar5);
    }
    pcVar5 = (char *)0x1d;
    local_28c = 0xbc;
    local_2a8 = 0x56c;
    bVar1 = true;
    local_2a0 = (char *)0x0;
    local_290 = 0x11;
    p_Var11 = local_298;
    do {
      local_288 = (int)pcVar5;
      if (local_290 < local_2a8) {
        iVar2 = local_290;
        iVar3 = 0;
        do {
          local_2a4 = iVar3;
          pcVar7 = local_228;
          pcVar5 = local_2a0;
          local_284 = iVar2;
          iVar2 = exr_read_tile_chunk_info(p_Var11,0,local_2a4,local_2a0,0,0,local_268);
          if (iVar2 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Return Error: (",0xf);
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
            pcVar7 = (char *)exr_get_default_error_message(iVar2);
            if (pcVar7 == (char *)0x0) {
              std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
            }
            else {
              sVar6 = strlen(pcVar7);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar6);
            }
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
            std::ostream::put((char)poVar4);
            std::ostream::flush();
            core_test_fail("exr_read_tile_chunk_info (f, 0, tilex, tiley, 0, 0, &cinfo)",
                           (char *)0x3f1,0x185706,pcVar5);
          }
          if (bVar1) {
            iVar2 = exr_decoding_initialize(p_Var11,0,local_268);
            if (iVar2 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Return Error: (",0xf);
              poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
              pcVar5 = (char *)exr_get_default_error_message(iVar2);
              if (pcVar5 == (char *)0x0) {
                std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
              }
              else {
                sVar6 = strlen(pcVar5);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
              }
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
              std::ostream::put((char)poVar4);
              std::ostream::flush();
              core_test_fail("exr_decoding_initialize (f, 0, &cinfo, &decoder)",(char *)0x3f5,
                             0x185706,pcVar7);
            }
          }
          else {
            iVar2 = exr_decoding_update(p_Var11,0,local_268);
            if (iVar2 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Return Error: (",0xf);
              poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
              pcVar5 = (char *)exr_get_default_error_message(iVar2);
              if (pcVar5 == (char *)0x0) {
                std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
              }
              else {
                sVar6 = strlen(pcVar5);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
              }
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
              std::ostream::put((char)poVar4);
              std::ostream::flush();
              core_test_fail("exr_decoding_update (f, 0, &cinfo, &decoder)",(char *)0x3fa,0x185706,
                             pcVar7);
            }
          }
          if (0 < local_218) {
            iVar3 = local_2b0 * (int)local_2a0;
            iVar2 = p->_stride_x;
            iVar8 = local_2ac * local_2a4;
            lVar10 = 0;
            lVar9 = 0;
            do {
              pcVar5 = local_220;
              fill_pointers(p,(exr_coding_channel_info_t *)(local_220 + lVar10),
                            iVar8 + iVar3 * iVar2,&local_270,(int32_t *)&local_27c,&local_280);
              if (local_27c != (int)*(short *)(pcVar5 + lVar10 + 0x1c)) {
                core_test_fail("curchan.user_bytes_per_element == pixelstride",(char *)0x40a,
                               0x185706,(char *)(ulong)(uint)(int)*(short *)(pcVar5 + lVar10 + 0x1c)
                              );
              }
              *(void **)(local_220 + lVar10 + 0x28) = local_270;
              *(uint *)(local_220 + lVar10 + 0x20) = local_27c;
              *(int32_t *)(local_220 + lVar10 + 0x24) = local_280;
              lVar9 = lVar9 + 1;
              lVar10 = lVar10 + 0x30;
              pcVar7 = local_220;
            } while (lVar9 < local_218);
          }
          p_Var11 = local_298;
          if ((bVar1) &&
             (iVar2 = exr_decoding_choose_default_routines(local_298,0,local_228), iVar2 != 0)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Return Error: (",0xf);
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
            pcVar5 = (char *)exr_get_default_error_message(iVar2);
            if (pcVar5 == (char *)0x0) {
              std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
            }
            else {
              sVar6 = strlen(pcVar5);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
            }
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
            std::ostream::put((char)poVar4);
            std::ostream::flush();
            core_test_fail("exr_decoding_choose_default_routines (f, 0, &decoder)",(char *)0x414,
                           0x185706,pcVar7);
          }
          iVar2 = exr_decoding_run(p_Var11,0,local_228);
          if (iVar2 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Return Error: (",0xf);
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
            pcVar5 = (char *)exr_get_default_error_message(iVar2);
            if (pcVar5 == (char *)0x0) {
              std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
            }
            else {
              sVar6 = strlen(pcVar5);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
            }
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
            std::ostream::put((char)poVar4);
            std::ostream::flush();
            core_test_fail("exr_decoding_run (f, 0, &decoder)",(char *)0x416,0x185706,pcVar7);
          }
          iVar2 = local_284 + local_2ac;
          bVar1 = false;
          iVar3 = local_2a4 + 1;
        } while (iVar2 < local_2a8);
      }
      pcVar5 = (char *)(ulong)(uint)(local_288 + local_2b0);
      local_2a0 = (char *)(ulong)((int)local_2a0 + 1);
      if (local_28c <= local_288 + local_2b0) {
        iVar2 = exr_decoding_destroy(p_Var11,local_228);
        if (iVar2 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
          pcVar7 = (char *)exr_get_default_error_message(iVar2);
          if (pcVar7 == (char *)0x0) {
            std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
          }
          else {
            sVar6 = strlen(pcVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar6);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          core_test_fail("exr_decoding_destroy (f, &decoder)",(char *)0x41a,0x185706,pcVar5);
        }
        return;
      }
    } while( true );
  }
  core_test_fail("tlevx == 1 && tlevy == 1",(char *)0x3e0,0x185706,(char *)func);
}

Assistant:

static void
doDecodeTile (exr_context_t f, pixels& p, int xs, int ys)
{
    int32_t               tlevx, tlevy;
    int32_t               tilew, tileh;
    int32_t               tilex, tiley;
    int                   y, endy;
    int                   x, endx;
    exr_chunk_info_t      cinfo;
    exr_decode_pipeline_t decoder;
    bool                  first = true;

    EXRCORE_TEST (xs == 1 && ys == 1);
    EXRCORE_TEST_RVAL (exr_get_tile_levels (f, 0, &tlevx, &tlevy));
    EXRCORE_TEST (tlevx == 1 && tlevy == 1);

    EXRCORE_TEST_RVAL (exr_get_tile_sizes (f, 0, 0, 0, &tilew, &tileh));
    EXRCORE_TEST (tilew == 32 && tileh == 32);

    y     = IMG_DATA_Y * ys;
    endy  = y + IMG_HEIGHT * ys;
    tiley = 0;
    for (; y < endy; y += tileh, ++tiley)
    {
        tilex = 0;

        x    = IMG_DATA_X * xs;
        endx = x + IMG_WIDTH * xs;
        for (; x < endx; x += tilew, ++tilex)
        {
            EXRCORE_TEST_RVAL (
                exr_read_tile_chunk_info (f, 0, tilex, tiley, 0, 0, &cinfo));
            if (first)
            {
                EXRCORE_TEST_RVAL (
                    exr_decoding_initialize (f, 0, &cinfo, &decoder));
            }
            else
            {
                EXRCORE_TEST_RVAL (
                    exr_decoding_update (f, 0, &cinfo, &decoder));
            }

            int32_t idxoffset = tiley * tileh * p._stride_x + tilex * tilew;

            for (int c = 0; c < decoder.channel_count; ++c)
            {
                const exr_coding_channel_info_t& curchan = decoder.channels[c];
                void*                            ptr;
                int32_t                          pixelstride;
                int32_t                          linestride;

                fill_pointers (
                    p, curchan, idxoffset, &ptr, &pixelstride, &linestride);

                // make sure the setup has initialized our bytes for us
                EXRCORE_TEST (curchan.user_bytes_per_element == pixelstride);

                decoder.channels[c].decode_to_ptr     = (uint8_t*) ptr;
                decoder.channels[c].user_pixel_stride = pixelstride;
                decoder.channels[c].user_line_stride  = linestride;
            }

            if (first)
            {
                EXRCORE_TEST_RVAL (
                    exr_decoding_choose_default_routines (f, 0, &decoder));
            }
            EXRCORE_TEST_RVAL (exr_decoding_run (f, 0, &decoder));
            first = false;
        }
    }
    EXRCORE_TEST_RVAL (exr_decoding_destroy (f, &decoder));
}